

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::IsQLAExpanded(AmpIO *this,uint index)

{
  bool bVar1;
  uint32_t uVar2;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x514c4131) {
    bVar1 = (bool)((*(byte *)((long)this->ReadBuffer + 5) & 0x10) >> 4);
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x44514c41) {
      bVar1 = (index & this->ReadBuffer[1] & 3) != 0;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool AmpIO::IsQLAExpanded(unsigned int index) const
{
    bool ret = false;
    if (GetHardwareVersion() == QLA1_String)
        ret = GetStatus() & 0x00001000;
    else if (GetHardwareVersion() == DQLA_String)
        ret = GetStatus() & (index&0x0003);
    return ret;
}